

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_csv_relation.cpp
# Opt level: O2

BoundStatement * __thiscall
duckdb::WriteCSVRelation::Bind
          (BoundStatement *__return_storage_ptr__,WriteCSVRelation *this,Binder *binder)

{
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> uVar3;
  Relation *pRVar4;
  pointer pCVar5;
  pointer *__ptr;
  CopyStatement copy;
  _Head_base<0UL,_duckdb::CopyInfo_*,_false> local_a8;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> local_a0;
  CopyStatement local_98;
  
  CopyStatement::CopyStatement(&local_98);
  make_uniq<duckdb::CopyInfo>();
  pRVar4 = shared_ptr<duckdb::Relation,_true>::operator->(&this->child);
  (*pRVar4->_vptr_Relation[3])(&local_a0,pRVar4);
  pCVar5 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_a8);
  _Var2._M_head_impl = local_a0._M_head_impl;
  local_a0._M_head_impl = (QueryNode *)0x0;
  _Var1._M_head_impl =
       (pCVar5->select_statement).
       super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
       super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
  (pCVar5->select_statement).
  super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
  super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var1._M_head_impl != (QueryNode *)0x0) {
    (**(code **)((long)(_Var1._M_head_impl)->_vptr_QueryNode + 8))();
    if (local_a0._M_head_impl != (QueryNode *)0x0) {
      (*(local_a0._M_head_impl)->_vptr_QueryNode[1])();
    }
  }
  pCVar5 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_a8);
  pCVar5->is_from = false;
  pCVar5 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_a8);
  ::std::__cxx11::string::_M_assign((string *)&pCVar5->file_path);
  pCVar5 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_a8);
  ::std::__cxx11::string::assign((char *)&pCVar5->format);
  pCVar5 = unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true>::operator->
                     ((unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true> *)
                      &local_a8);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::operator=(&(pCVar5->options)._M_h,&(this->options)._M_h);
  uVar3.super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
  super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl =
       (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)
       (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)local_98.info;
  local_98.info.super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
  super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
  super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl =
       (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)
       (unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>)local_a8._M_head_impl;
  local_a8._M_head_impl = (CopyInfo *)0x0;
  if (uVar3.super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
      super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl !=
      (__uniq_ptr_data<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>,_true,_true>)0x0) {
    (*((ParseInfo *)
      uVar3.super_unique_ptr<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
      super___uniq_ptr_impl<duckdb::CopyInfo,_std::default_delete<duckdb::CopyInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::CopyInfo_*,_std::default_delete<duckdb::CopyInfo>_>.
      super__Head_base<0UL,_duckdb::CopyInfo_*,_false>._M_head_impl)->_vptr_ParseInfo[1])();
  }
  Binder::Bind(__return_storage_ptr__,binder,&local_98.super_SQLStatement);
  if (local_a8._M_head_impl != (CopyInfo *)0x0) {
    (*((local_a8._M_head_impl)->super_ParseInfo)._vptr_ParseInfo[1])();
  }
  CopyStatement::~CopyStatement(&local_98);
  return __return_storage_ptr__;
}

Assistant:

BoundStatement WriteCSVRelation::Bind(Binder &binder) {
	CopyStatement copy;
	auto info = make_uniq<CopyInfo>();
	info->select_statement = child->GetQueryNode();
	info->is_from = false;
	info->file_path = csv_file;
	info->format = "csv";
	info->options = options;
	copy.info = std::move(info);
	return binder.Bind(copy.Cast<SQLStatement>());
}